

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

float __thiscall V2LRC::step_2x(V2LRC *this,float in,float freq,float reso)

{
  float fVar1;
  float h;
  float reso_local;
  float freq_local;
  float in_local;
  V2LRC *this_local;
  
  this->l = freq * this->b + -3.8146973e-06 + this->l;
  this->b = freq * ((-this->b * reso + in + 3.8146973e-06) - this->l) + this->b;
  this->l = freq * this->b + this->l;
  fVar1 = (-this->b * reso + in + 3.8146973e-06) - this->l;
  this->b = freq * fVar1 + this->b;
  return fVar1;
}

Assistant:

float step_2x(float in, float freq, float reso)
    {
        // the filters get slightly biased inputs to avoid the state variables
        // getting too close to 0 for prolonged periods of time (which would
        // cause denormals to appear)
        in += fcdcoffset;

        // step 1
        l += freq * b - fcdcoffset; // undo bias here (1 sample delay)
        b += freq * (in - b*reso - l);

        // step 2
        l += freq * b;
        float h = in - b*reso - l;
        b += freq * h;

        return h;
    }